

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

bool dxil_spv::emit_wmma_return_values(Impl *impl,Id type_id,Id id,uint32_t phase)

{
  CallInst *value;
  bool bVar1;
  mapped_type *pmVar2;
  int iVar3;
  CallInst *local_38;
  
  bVar1 = validate_wmma_io_registers
                    (impl,(impl->ags).num_instructions - 8,
                     AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,phase,false);
  if (bVar1) {
    iVar3 = -8;
    do {
      value = (impl->ags).backdoor_instructions[(impl->ags).num_instructions + iVar3];
      if (id != 0) {
        Converter::Impl::rewrite_value(impl,(Value *)value,id);
      }
      local_38 = value;
      pmVar2 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(impl->ags).coopmat_component_mapping,(key_type *)&local_38);
      pmVar2->type_id = type_id;
      pmVar2->component = iVar3 + 8;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
  }
  return bVar1;
}

Assistant:

static bool emit_wmma_return_values(Converter::Impl &impl, spv::Id type_id, spv::Id id, uint32_t phase)
{
	if (!validate_wmma_io_registers(impl, impl.ags.num_instructions - 8,
	                                AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,
	                                phase, false))
	{
		return false;
	}

	// Validate output register assignment.
	for (uint32_t i = 0; i < 8; i++)
	{
		uint32_t inst_index = impl.ags.num_instructions - 8 + i;
		auto *inst = impl.ags.backdoor_instructions[inst_index];
		if (id)
			impl.rewrite_value(inst, id);
		impl.ags.coopmat_component_mapping[inst] = { type_id, i };
	}

	return true;
}